

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Matrix *matrix)

{
  undefined8 in_RAX;
  vector<double,_std::allocator<double>_> *pvVar1;
  ostream *poVar2;
  ulong uVar3;
  uint index;
  undefined8 uStack_38;
  
  if ((matrix->m_shape).field_0.m_dims[0] != 0) {
    index = 0;
    uStack_38 = in_RAX;
    do {
      if ((matrix->m_shape).field_0.m_dims[1] != 0) {
        uVar3 = 0;
        do {
          pvVar1 = Matrix::operator[](matrix,index);
          poVar2 = std::ostream::_M_insert<double>
                             ((pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar3]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (matrix->m_shape).field_0.m_dims[1]);
      }
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
      index = index + 1;
    } while (index < (matrix->m_shape).field_0.m_dims[0]);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Matrix& matrix){
    for(uint i=0;i<matrix.m_shape.n_row;++i){
        for(uint j=0;j<matrix.m_shape.n_col;++j){
            out<<matrix[i][j]<<"\t";
        }   out<<'\n';
    }

    return out;
}